

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O2

char * monster_blow_method_action(blow_method *method,wchar_t midx)

{
  byte bVar1;
  char cVar2;
  uint32_t uVar3;
  int iVar4;
  monster *mon;
  char *pcVar5;
  ushort **ppuVar6;
  wchar_t mode;
  char *pcVar7;
  blow_message *pbVar8;
  char *pcVar9;
  bool bVar10;
  size_t end;
  char punct [8];
  char m_name [80];
  char buf [1024];
  
  builtin_strncpy(punct,".!?;:,\'",8);
  mon = (monster *)0x0;
  memset(buf,0,0x400);
  end = 0;
  uVar3 = Rand_div(method->num_messages);
  pbVar8 = method->messages;
  if (L'\0' < midx) {
    mon = cave_monster(cave,midx);
  }
  while (bVar10 = uVar3 != 0, uVar3 = uVar3 - 1, bVar10) {
    pbVar8 = pbVar8->next;
  }
  pcVar7 = pbVar8->act_msg;
  pcVar5 = strchr(pcVar7,0x7b);
  do {
    if (pcVar5 == (char *)0x0) {
      strnfcat(buf,0x400,&end,"%s",pcVar7);
      pcVar7 = string_make(buf);
      return pcVar7;
    }
    strnfcat(buf,0x400,&end,"%.*s",(ulong)(uint)((int)pcVar5 - (int)pcVar7),pcVar7);
    pcVar7 = pcVar5 + 1;
    pcVar9 = pcVar5 + 2;
    while( true ) {
      bVar1 = pcVar9[-1];
      if ((ulong)bVar1 == 0) break;
      ppuVar6 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar6 + (ulong)bVar1 * 2 + 1) & 4) == 0) {
        if (bVar1 != 0x7d) break;
        iVar4 = strncmp(pcVar7,"target",6);
        if (iVar4 == 0) {
          if (L'\0' < midx) {
            pcVar7 = strchr(punct,(int)*pcVar9);
            mode = (uint)(pcVar7 == (char *)0x0) << 9 | 0x15;
LAB_00161625:
            monster_desc(m_name,0x50,mon,mode);
            strnfcat(buf,0x400,&end,"%s",m_name);
            pcVar7 = pcVar9;
            break;
          }
          pcVar7 = "you";
        }
        else {
          iVar4 = strncmp(pcVar7,"oftarget",8);
          if (iVar4 == 0) {
            if (L'\0' < midx) {
              mode = L'\x17';
              goto LAB_00161625;
            }
            pcVar7 = "your";
          }
          else {
            cVar2 = *pcVar7;
            pcVar7 = pcVar9;
            if (((cVar2 != 'h') || (pcVar5[2] != 'a')) || (pcVar5[3] != 's')) break;
            if (midx < L'\x01') {
              pcVar7 = "have";
            }
            else {
              pcVar7 = "has";
            }
          }
        }
        strnfcat(buf,0x400,&end,pcVar7);
        pcVar7 = pcVar9;
        break;
      }
      pcVar9 = pcVar9 + 1;
    }
    pcVar5 = strchr(pcVar7,0x7b);
  } while( true );
}

Assistant:

char *monster_blow_method_action(const struct blow_method *method, int midx)
{
	const char punct[] = ".!?;:,'";
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	const char *in_cursor;
	size_t end = 0;
	struct monster *t_mon = NULL;

	int choice = randint0(method->num_messages);
	const struct blow_message *msg = method->messages;

	/* Get the target monster, if any */
	if (midx > 0) {
		t_mon = cave_monster(cave, midx);
	}

	/* Pick a message */
	while (choice--) {
		msg = msg->next;
	}
	in_cursor = msg->act_msg;

	/* Add info to the message */
	next = strchr(in_cursor, '{');
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - in_cursor),
			in_cursor);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			in_cursor = s + 1;

			switch (blow_tag_lookup(tag)) {
				case BLOW_TAG_TARGET: {
					char m_name[80];
					if (midx > 0) {
						int mdesc_mode = MDESC_TARG;

						if (!strchr(punct, *in_cursor)) {
							mdesc_mode |= MDESC_COMMA;
						}
						monster_desc(m_name,
							sizeof(m_name), t_mon,
							mdesc_mode);
						strnfcat(buf, sizeof(buf),
							&end, "%s", m_name);
					} else {
						strnfcat(buf, sizeof(buf), &end, "you");
					}
					break;
				}
				case BLOW_TAG_OF_TARGET: {
					char m_name[80];
					if (midx > 0) {
						monster_desc(m_name,
							sizeof(m_name), t_mon,
							MDESC_TARG | MDESC_POSS);
						strnfcat(buf, sizeof(buf), &end, "%s", m_name);
					} else {
						strnfcat(buf, sizeof(buf), &end, "your");
					}
					break;
				}
				case BLOW_TAG_HAS: {
					if (midx > 0) {
						strnfcat(buf, sizeof(buf), &end, "has");
					} else {
						strnfcat(buf, sizeof(buf), &end, "have");
					}
					break;
				}

				default: {
					break;
				}
			}
		} else {
			/* An invalid tag, skip it */
			in_cursor = next + 1;
		}

		next = strchr(in_cursor, '{');
	}
	strnfcat(buf, 1024, &end, "%s", in_cursor);
	return string_make(buf);
}